

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O2

void __thiscall xmrig::Controller::stop(Controller *this)

{
  Base::stop(&this->super_Base);
  if (this->m_network != (Network *)0x0) {
    (*(this->m_network->super_IJobResultListener)._vptr_IJobResultListener[1])();
  }
  this->m_network = (Network *)0x0;
  Miner::stop(this->m_miner);
  if (this->m_miner != (Miner *)0x0) {
    (*(this->m_miner->super_ITimerListener)._vptr_ITimerListener[1])();
  }
  this->m_miner = (Miner *)0x0;
  return;
}

Assistant:

void xmrig::Controller::stop()
{
    Base::stop();

    delete m_network;
    m_network = nullptr;

    m_miner->stop();

    delete m_miner;
    m_miner = nullptr;
}